

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_storage.cpp
# Opt level: O0

bool __thiscall
miniros::master::ParameterStorage::hasParam(ParameterStorage *this,string *caller_id,string *key)

{
  Path *in_RDX;
  ParameterStorage *in_RSI;
  byte bVar1;
  pair<XmlRpc::XmlRpcValue_*,_XmlRpc::XmlRpcValue_*> pVar2;
  RpcValue *param;
  scoped_lock<std::mutex> lock;
  Path fullPath;
  string fullKey;
  mutex_type *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  string *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  string local_38 [31];
  undefined1 in_stack_ffffffffffffffe7;
  
  names::resolve((string *)fullKey.field_2._8_8_,(string *)fullKey.field_2._M_allocated_capacity,
                 fullKey._M_string_length._7_1_);
  names::Path::Path((Path *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  names::Path::fromString
            ((Path *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60);
  ::std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18
            );
  pVar2 = findParameter(in_RSI,in_RDX,(bool)in_stack_ffffffffffffffe7);
  bVar1 = pVar2.first != (XmlRpcValue *)0x0;
  ::std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x5521ae);
  names::Path::~Path((Path *)CONCAT17(bVar1,in_stack_ffffffffffffff20));
  ::std::__cxx11::string::~string(local_38);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ParameterStorage::hasParam(const std::string& caller_id, const std::string& key) const
{
  std::string fullKey = miniros::names::resolve(caller_id, key, false);
  names::Path fullPath;
  fullPath.fromString(fullKey);

  std::scoped_lock<std::mutex> lock(m_parameterLock);
  RpcValue* param = this->findParameter(fullPath, false).first;
  return param != nullptr;
}